

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O3

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
::~ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
                   *this)

{
  StringSerialiser *__ptr;
  pointer puVar1;
  CCITT *pCVar2;
  pointer pWVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FIRFilter *__ptr_00;
  pointer psVar4;
  Flywheel *pFVar5;
  long lVar6;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059de58;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059df50;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059df88;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059dfa0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059dfb8;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059dfd0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059e000;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059e040;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_0059e060;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_0059e078;
  (this->super_Delegate).super_Delegate._vptr_Delegate = (_func_int **)&DAT_0059e090;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0059e0b0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059e0c8;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_0059e0e8;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  __ptr = (this->string_serialiser_)._M_t.
          super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
          ._M_t.
          super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
          .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl;
  if (__ptr != (StringSerialiser *)0x0) {
    std::default_delete<Utility::StringSerialiser>::operator()
              ((default_delete<Utility::StringSerialiser> *)&this->string_serialiser_,__ptr);
  }
  (this->string_serialiser_)._M_t.
  super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>.
  _M_t.
  super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
  .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl = (StringSerialiser *)0x0;
  puVar1 = (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->pravetz_rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  (this->diskii_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059c3e8;
  (this->diskii_).object_.super_EventDelegate._vptr_EventDelegate =
       (_func_int **)&PTR_process_event_005906c8;
  (this->diskii_).object_.super_Source._vptr_Source = (_func_int **)&DAT_00590700;
  (this->diskii_).object_.super_Observer._vptr_Observer = (_func_int **)&DAT_00590718;
  lVar6 = 0;
  do {
    Storage::Disk::Drive::~Drive((Drive *)(&(this->diskii_).object_.field_0x2b0 + lVar6));
    lVar6 = lVar6 + -0x170;
  } while (lVar6 != -0x2e0);
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.super_Source
  ._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a20a0;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a20f0;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a2118;
  pCVar2 = (this->bd500_).super_DiskController.super_WD1770.super_MFMController.shifter_.
           owned_crc_generator_._M_t.
           super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
           super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
           super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl;
  if (pCVar2 != (CCITT *)0x0) {
    operator_delete(pCVar2,0x202);
  }
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.shifter_.owned_crc_generator_
  ._M_t.super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
  super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
  super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl = (CCITT *)0x0;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.super_Source
  ._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a1fd0;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a2018;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a2040;
  std::
  vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ::~vector(&(this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
             drives_);
  Storage::Disk::Drive::~Drive
            (&(this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
              empty_drive_);
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a20a0;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a20f0;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a2118;
  pCVar2 = (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.shifter_.
           owned_crc_generator_._M_t.
           super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
           super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
           super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl;
  if (pCVar2 != (CCITT *)0x0) {
    operator_delete(pCVar2,0x202);
  }
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.shifter_.
  owned_crc_generator_._M_t.super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t
  .super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
  super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl = (CCITT *)0x0;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a1fd0;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a2018;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a2040;
  std::
  vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ::~vector(&(this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
             drives_);
  Storage::Disk::Drive::~Drive
            (&(this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller
              .empty_drive_);
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a20a0;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a20f0;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a2118;
  pCVar2 = (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.shifter_.
           owned_crc_generator_._M_t.
           super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
           super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
           super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl;
  if (pCVar2 != (CCITT *)0x0) {
    operator_delete(pCVar2,0x202);
  }
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.shifter_.
  owned_crc_generator_._M_t.super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t
  .super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
  super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl = (CCITT *)0x0;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a1fd0;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a2018;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a2040;
  std::
  vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ::~vector(&(this->microdisc_).super_DiskController.super_WD1770.super_MFMController.
             super_Controller.drives_);
  Storage::Disk::Drive::~Drive
            (&(this->microdisc_).super_DiskController.super_WD1770.super_MFMController.
              super_Controller.empty_drive_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::~vector(&(this->via_port_handler_).joysticks_);
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_TimedEventLoop.
  _vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_0059c308;
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_Source._vptr_Source =
       (_func_int **)&DAT_0059c348;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  super_Parser<Storage::Tape::Oric::SymbolType>._vptr_Parser =
       (_func_int **)&PTR___cxa_pure_virtual_0058de78;
  pWVar3 = (this->tape_player_).parser_.
           super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>
           .wave_queue_.
           super__Vector_base<Storage::Tape::Oric::WaveType,_std::allocator<Storage::Tape::Oric::WaveType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pWVar3 != (pointer)0x0) {
    operator_delete(pWVar3,(long)*(pointer *)
                                  ((long)&(this->tape_player_).parser_.
                                          super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>
                                          .wave_queue_.
                                          super__Vector_base<Storage::Tape::Oric::WaveType,_std::allocator<Storage::Tape::Oric::WaveType>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pWVar3);
  }
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_TimedEventLoop.
  _vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_005a3a68;
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_Source._vptr_Source =
       (_func_int **)&DAT_005a3aa8;
  this_00 = (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.tape_.
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__LowpassBase_00596828;
  __ptr_00 = (this->speaker_).
             super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
             filter_._M_t.
             super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
             .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  if (__ptr_00 != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)
               &(this->speaker_).
                super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                .filter_,__ptr_00);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.filter_._M_t
  .
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = (FIRFilter *)0x0;
  psVar4 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
           output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                                 .output_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar4);
  }
  psVar4 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
           input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                                 .input_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar4);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__Speaker_0058ce68;
  psVar4 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
           super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)*(pointer *)
                                  ((long)&(this->speaker_).
                                          super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                                          .super_Speaker.mix_buffer_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar4);
  }
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  (this->video_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059c2d8;
  pFVar5 = (this->video_).object_.crt_.vertical_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar5 != (Flywheel *)0x0) {
    operator_delete(pFVar5,0x24);
  }
  (this->video_).object_.crt_.vertical_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  pFVar5 = (this->video_).object_.crt_.horizontal_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar5 != (Flywheel *)0x0) {
    operator_delete(pFVar5,0x24);
  }
  (this->video_).object_.crt_.horizontal_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  puVar1 = (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->disk_rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00599ae0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00599b10;
  Inputs::Keyboard::~Keyboard(&(this->super_MappedKeyboardMachine).keyboard_);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}